

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O1

size_t phosg::count_zeroes(void *vdata,size_t size,size_t stride)

{
  size_t sVar1;
  ulong uVar2;
  
  if (size != 0) {
    uVar2 = 0;
    sVar1 = 0;
    do {
      sVar1 = sVar1 + (*(char *)((long)vdata + uVar2) == '\0');
      uVar2 = uVar2 + stride;
    } while (uVar2 < size);
    return sVar1;
  }
  return 0;
}

Assistant:

size_t count_zeroes(const void* vdata, size_t size, size_t stride) {
  const uint8_t* data = reinterpret_cast<const uint8_t*>(vdata);
  size_t zero_count = 0;
  for (size_t z = 0; z < size; z += stride) {
    if (data[z] == 0) {
      zero_count++;
    }
  }
  return zero_count;
}